

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qtimer.cpp
# Opt level: O0

void QTimer::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long lVar1;
  TimerType *pTVar2;
  undefined8 *puVar3;
  bool bVar4;
  TimerType TVar5;
  QtMocHelpers *in_RCX;
  int in_EDX;
  int in_ESI;
  QTimer *in_RDI;
  long in_FS_OFFSET;
  QBindable<int> QVar6;
  QBindable<Qt::TimerType> QVar7;
  QBindable<bool> QVar8;
  void *_v_1;
  void *_v;
  QTimer *_t;
  undefined4 in_stack_ffffffffffffff48;
  TimerType in_stack_ffffffffffffff4c;
  QTimer *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  QTimer *in_stack_ffffffffffffff60;
  QUntypedPropertyData *local_48;
  QBindableInterface *local_40;
  QUntypedPropertyData *local_38;
  QBindableInterface *local_30;
  QUntypedPropertyData *local_28;
  QBindableInterface *local_20;
  QUntypedPropertyData *local_18;
  QBindableInterface *local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    switch(in_EDX) {
    case 0:
      timeout(in_RDI);
      break;
    case 1:
      start((QTimer *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),0);
      break;
    case 2:
      start(in_stack_ffffffffffffff60);
      break;
    case 3:
      stop(in_stack_ffffffffffffff50);
    }
  }
  if ((in_ESI != 5) ||
     (bVar4 = QtMocHelpers::indexOfMethod<void(QTimer::*)(QTimer::QPrivateSignal)>
                        (in_RCX,(void **)timeout,0,0), !bVar4)) {
    if (in_ESI == 1) {
      pTVar2 = *(TimerType **)in_RCX;
      switch(in_EDX) {
      case 0:
        bVar4 = isSingleShot((QTimer *)0x42c07d);
        *(bool *)pTVar2 = bVar4;
        break;
      case 1:
        TVar5 = interval((QTimer *)0x42c095);
        *pTVar2 = TVar5;
        break;
      case 2:
        TVar5 = remainingTime(in_stack_ffffffffffffff50);
        *pTVar2 = TVar5;
        break;
      case 3:
        TVar5 = timerType((QTimer *)0x42c0bf);
        *pTVar2 = TVar5;
        break;
      case 4:
        bVar4 = isActive((QTimer *)0x42c0d4);
        *(bool *)pTVar2 = bVar4;
      }
    }
    if (in_ESI == 2) {
      in_stack_ffffffffffffff5c = in_EDX;
      if (in_EDX == 0) {
        setSingleShot(in_stack_ffffffffffffff50,SUB41(in_stack_ffffffffffffff4c >> 0x18,0));
      }
      else if (in_EDX == 1) {
        setInterval((QTimer *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),1);
      }
      else if (in_EDX == 3) {
        setTimerType(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      }
    }
    if (in_ESI == 8) {
      switch(in_EDX) {
      case 0:
        QVar8 = bindableSingleShot((QTimer *)
                                   CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        puVar3 = *(undefined8 **)in_RCX;
        local_18 = QVar8.super_QUntypedBindable.data;
        *puVar3 = local_18;
        local_10 = QVar8.super_QUntypedBindable.iface;
        puVar3[1] = local_10;
        break;
      case 1:
        QVar6 = bindableInterval((QTimer *)
                                 CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        puVar3 = *(undefined8 **)in_RCX;
        local_28 = QVar6.super_QUntypedBindable.data;
        *puVar3 = local_28;
        local_20 = QVar6.super_QUntypedBindable.iface;
        puVar3[1] = local_20;
        break;
      default:
        break;
      case 3:
        QVar7 = bindableTimerType((QTimer *)
                                  CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        puVar3 = *(undefined8 **)in_RCX;
        local_38 = QVar7.super_QUntypedBindable.data;
        *puVar3 = local_38;
        local_30 = QVar7.super_QUntypedBindable.iface;
        puVar3[1] = local_30;
        break;
      case 4:
        QVar8 = bindableActive((QTimer *)
                               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        puVar3 = *(undefined8 **)in_RCX;
        local_48 = QVar8.super_QUntypedBindable.data;
        *puVar3 = local_48;
        local_40 = QVar8.super_QUntypedBindable.iface;
        puVar3[1] = local_40;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTimer::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QTimer *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->timeout(QPrivateSignal()); break;
        case 1: _t->start((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 2: _t->start(); break;
        case 3: _t->stop(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QTimer::*)(QPrivateSignal)>(_a, &QTimer::timeout, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->isSingleShot(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->interval(); break;
        case 2: *reinterpret_cast<int*>(_v) = _t->remainingTime(); break;
        case 3: *reinterpret_cast<Qt::TimerType*>(_v) = _t->timerType(); break;
        case 4: *reinterpret_cast<bool*>(_v) = _t->isActive(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setSingleShot(*reinterpret_cast<bool*>(_v)); break;
        case 1: _t->setInterval(*reinterpret_cast<int*>(_v)); break;
        case 3: _t->setTimerType(*reinterpret_cast<Qt::TimerType*>(_v)); break;
        default: break;
        }
    }
    if (_c == QMetaObject::BindableProperty) {
        switch (_id) {
        case 0: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableSingleShot(); break;
        case 1: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableInterval(); break;
        case 3: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableTimerType(); break;
        case 4: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableActive(); break;
        default: break;
        }
    }
}